

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O2

void __thiscall
sc_core::sc_signal_t<bool,_(sc_core::sc_writer_policy)1>::sc_signal_t
          (sc_signal_t<bool,_(sc_core::sc_writer_policy)1> *this,void **vtt,char *name_,
          bool *initial_value_)

{
  bool bVar1;
  sc_signal_in_if<bool> sVar2;
  
  sc_signal_inout_if<bool>::sc_signal_inout_if(&this->super_sc_signal_inout_if<bool>,vtt + 1);
  sc_signal_channel::sc_signal_channel(&this->super_sc_signal_channel,name_);
  (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)1>).
  super_sc_writer_policy_check_delta.super_sc_writer_policy_check_write.m_delta_only = true;
  (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)1>).
  super_sc_writer_policy_check_delta.super_sc_writer_policy_check_write.m_writer_p.m_target_p =
       (sc_process_b *)0x0;
  sVar2 = (sc_signal_in_if<bool>)*vtt;
  (this->super_sc_signal_inout_if<bool>).super_sc_signal_in_if<bool> = sVar2;
  *(void **)(&(this->super_sc_signal_inout_if<bool>).super_sc_signal_in_if<bool>.field_0x0 +
            *(long *)((long)sVar2 + -0x30)) = vtt[8];
  (this->super_sc_signal_inout_if<bool>).super_sc_signal_write_if<bool> =
       *(sc_signal_write_if<bool> *)(vtt + 9);
  (this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object._vptr_sc_object =
       (_func_int **)&PTR_print_0025dcb0;
  bVar1 = *initial_value_;
  this->m_cur_val = bVar1;
  this->m_new_val = bVar1;
  return;
}

Assistant:

sc_signal_t( const char* name_, const T& initial_value_ )
      : base_type( name_ )
      , m_cur_val( initial_value_ )
      , m_new_val( initial_value_ )
    {}